

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

rf_mat * rf_mat_invert(rf_mat mat)

{
  rf_mat *in_RDI;
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float in_stack_00000008;
  float in_stack_0000000c;
  rf_mat *result;
  float invDet;
  float b11;
  float b10;
  float b09;
  float b08;
  float b07;
  float b06;
  float b05;
  float b04;
  float b03;
  float b02;
  float b01;
  float b00;
  float a33;
  float a32;
  float a31;
  float a30;
  float a23;
  float a22;
  float a21;
  float a20;
  float a13;
  float a12;
  float a11;
  float a10;
  float a03;
  float a02;
  float a01;
  float a00;
  
  memset(in_RDI,0,0x40);
  fVar1 = in_stack_00000008 * mat.m12 + -(mat.m8 * in_stack_0000000c);
  fVar2 = in_stack_00000008 * mat.m13 + -(mat.m9 * in_stack_0000000c);
  fVar3 = in_stack_00000008 * mat.m14 + -(mat.m10 * in_stack_0000000c);
  fVar4 = mat.m8 * mat.m13 + -(mat.m9 * mat.m12);
  fVar5 = mat.m8 * mat.m14 + -(mat.m10 * mat.m12);
  fVar6 = mat.m9 * mat.m14 + -(mat.m10 * mat.m13);
  fVar7 = mat.m0 * mat.m5 + -(mat.m1 * mat.m4);
  fVar8 = mat.m0 * mat.m6 + -(mat.m2 * mat.m4);
  fVar9 = mat.m0 * mat.m7 + -(mat.m3 * mat.m4);
  fVar10 = mat.m1 * mat.m6 + -(mat.m2 * mat.m5);
  fVar11 = mat.m1 * mat.m7 + -(mat.m3 * mat.m5);
  fVar12 = mat.m2 * mat.m7 + -(mat.m3 * mat.m6);
  fVar13 = 1.0 / (fVar6 * fVar7 +
                 -fVar5 * fVar8 +
                 fVar4 * fVar9 + fVar3 * fVar10 + fVar1 * fVar12 + -(fVar2 * fVar11));
  in_RDI->m0 = (mat.m14 * fVar10 + mat.m12 * fVar12 + -(mat.m13 * fVar11)) * fVar13;
  in_RDI->m1 = (-mat.m10 * fVar10 + -mat.m8 * fVar12 + mat.m9 * fVar11) * fVar13;
  in_RDI->m2 = (mat.m7 * fVar4 + mat.m5 * fVar6 + -(mat.m6 * fVar5)) * fVar13;
  in_RDI->m3 = (-mat.m3 * fVar4 + -mat.m1 * fVar6 + mat.m2 * fVar5) * fVar13;
  in_RDI->m4 = (-mat.m14 * fVar8 + -in_stack_0000000c * fVar12 + mat.m13 * fVar9) * fVar13;
  in_RDI->m5 = (mat.m10 * fVar8 + in_stack_00000008 * fVar12 + -(mat.m9 * fVar9)) * fVar13;
  in_RDI->m6 = (-mat.m7 * fVar2 + -mat.m4 * fVar6 + mat.m6 * fVar3) * fVar13;
  in_RDI->m7 = (mat.m3 * fVar2 + mat.m0 * fVar6 + -(mat.m2 * fVar3)) * fVar13;
  in_RDI->m8 = (mat.m14 * fVar7 + in_stack_0000000c * fVar11 + -(mat.m12 * fVar9)) * fVar13;
  in_RDI->m9 = (-mat.m10 * fVar7 + -in_stack_00000008 * fVar11 + mat.m8 * fVar9) * fVar13;
  in_RDI->m10 = (mat.m7 * fVar1 + mat.m4 * fVar5 + -(mat.m5 * fVar3)) * fVar13;
  in_RDI->m11 = (-mat.m3 * fVar1 + -mat.m0 * fVar5 + mat.m1 * fVar3) * fVar13;
  in_RDI->m12 = (-mat.m13 * fVar7 + -in_stack_0000000c * fVar10 + mat.m12 * fVar8) * fVar13;
  in_RDI->m13 = (mat.m9 * fVar7 + in_stack_00000008 * fVar10 + -(mat.m8 * fVar8)) * fVar13;
  in_RDI->m14 = (-mat.m6 * fVar1 + -mat.m4 * fVar4 + mat.m5 * fVar2) * fVar13;
  in_RDI->m15 = (mat.m2 * fVar1 + mat.m0 * fVar4 + -(mat.m1 * fVar2)) * fVar13;
  return in_RDI;
}

Assistant:

RF_API rf_mat rf_mat_invert(rf_mat mat)
{
    rf_mat result = {0};

// Cache the matrix values (speed optimization)
    float a00 = mat.m0, a01 = mat.m1, a02 = mat.m2, a03 = mat.m3;
    float a10 = mat.m4, a11 = mat.m5, a12 = mat.m6, a13 = mat.m7;
    float a20 = mat.m8, a21 = mat.m9, a22 = mat.m10, a23 = mat.m11;
    float a30 = mat.m12, a31 = mat.m13, a32 = mat.m14, a33 = mat.m15;

    float b00 = a00 * a11 - a01 * a10;
    float b01 = a00 * a12 - a02 * a10;
    float b02 = a00 * a13 - a03 * a10;
    float b03 = a01 * a12 - a02 * a11;
    float b04 = a01 * a13 - a03 * a11;
    float b05 = a02 * a13 - a03 * a12;
    float b06 = a20 * a31 - a21 * a30;
    float b07 = a20 * a32 - a22 * a30;
    float b08 = a20 * a33 - a23 * a30;
    float b09 = a21 * a32 - a22 * a31;
    float b10 = a21 * a33 - a23 * a31;
    float b11 = a22 * a33 - a23 * a32;

// Calculate the invert determinant (inlined to avoid double-caching)
    float invDet = 1.0f / (b00 * b11 - b01 * b10 + b02 * b09 + b03 * b08 - b04 * b07 + b05 * b06);

    result.m0 = (a11 * b11 - a12 * b10 + a13 * b09) * invDet;
    result.m1 = (-a01 * b11 + a02 * b10 - a03 * b09) * invDet;
    result.m2 = (a31 * b05 - a32 * b04 + a33 * b03) * invDet;
    result.m3 = (-a21 * b05 + a22 * b04 - a23 * b03) * invDet;
    result.m4 = (-a10 * b11 + a12 * b08 - a13 * b07) * invDet;
    result.m5 = (a00 * b11 - a02 * b08 + a03 * b07) * invDet;
    result.m6 = (-a30 * b05 + a32 * b02 - a33 * b01) * invDet;
    result.m7 = (a20 * b05 - a22 * b02 + a23 * b01) * invDet;
    result.m8 = (a10 * b10 - a11 * b08 + a13 * b06) * invDet;
    result.m9 = (-a00 * b10 + a01 * b08 - a03 * b06) * invDet;
    result.m10 = (a30 * b04 - a31 * b02 + a33 * b00) * invDet;
    result.m11 = (-a20 * b04 + a21 * b02 - a23 * b00) * invDet;
    result.m12 = (-a10 * b09 + a11 * b07 - a12 * b06) * invDet;
    result.m13 = (a00 * b09 - a01 * b07 + a02 * b06) * invDet;
    result.m14 = (-a30 * b03 + a31 * b01 - a32 * b00) * invDet;
    result.m15 = (a20 * b03 - a21 * b01 + a22 * b00) * invDet;

    return result;
}